

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O2

uint8_t __thiscall Emulator::wait_for_key_press(Emulator *this)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  
  while ((uVar1 = (this->keys).super__Base_bitset<1UL>._M_w, uVar1 == 0 && (this->running != false))
        ) {
    update_keys(this);
  }
  for (uVar2 = 0; uVar2 != 0x10; uVar2 = uVar2 + 1) {
    if ((uVar1 >> (uVar2 & 0x3f) & 1) != 0) goto LAB_00102a7a;
  }
  uVar2 = 0xff;
LAB_00102a7a:
  return (uint8_t)uVar2;
}

Assistant:

uint8_t Emulator::wait_for_key_press(){
	while (keys.none() && running)
		update_keys();
	for (int i = 0; i < 16; i++)
		if (keys[i])
			return i;
	
	// We get here if `running` was cleared. Doesn't matter, we're exiting.
	return -1;
}